

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KokkosProfilingSymbols.cpp
# Opt level: O2

void kokkosp_begin_parallel_reduce(char *name,uint32_t devID,uint64_t *kID)

{
  uint local_14;
  unsigned_long *local_10;
  char *local_8;
  
  cali::util::callback<void(char_const*,unsigned_int,unsigned_long*)>::operator()
            ((callback<void(char_const*,unsigned_int,unsigned_long*)> *)
             &kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback,&local_8,&local_14,&local_10)
  ;
  return;
}

Assistant:

void kokkosp_begin_parallel_reduce(const char* name, const uint32_t devID, uint64_t* kID)
{
    kokkosp_callbacks.kokkosp_begin_parallel_reduce_callback(name, devID, kID);
}